

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O1

void deqp::gles3::Functional::evalTexture3D(ShaderEvalContext *c,TexLookupParams *p)

{
  Texture3D *pTVar1;
  int i;
  long lVar2;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  float local_48 [4];
  undefined8 local_38;
  undefined8 uStack_30;
  tcu local_20 [16];
  
  pTVar1 = c->textures[0].tex3D;
  tcu::sampleLevelArray3D
            (local_20,(pTVar1->m_view).m_levels,(pTVar1->m_view).m_numLevels,&c->textures[0].sampler
             ,c->in[0].m_data[0],c->in[0].m_data[1],c->in[0].m_data[2],p->lod);
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  lVar2 = 0;
  do {
    local_48[lVar2] = *(float *)(local_20 + lVar2 * 4) * (p->scale).m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_38 = 0;
  uStack_30 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_38 + lVar2 * 4) = local_48[lVar2] + (p->bias).m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  *(undefined8 *)(c->color).m_data = local_38;
  *(undefined8 *)((c->color).m_data + 2) = uStack_30;
  return;
}

Assistant:

static void		evalTexture3D			(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture3D(c, c.in[0].x(), c.in[0].y(), c.in[0].z(), p.lod)*p.scale + p.bias; }